

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_basic_string_only<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  reference pcVar2;
  context<toml::type_config> *in_RDX;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  location loc2;
  iterator iter;
  string_type val;
  string str;
  region reg;
  spec *spec;
  location first;
  context<toml::type_config> *in_stack_00000a00;
  location *in_stack_00000a08;
  value_type *in_stack_fffffffffffffaa8;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  location *in_stack_fffffffffffffac8;
  undefined1 *__n;
  location *in_stack_fffffffffffffad0;
  allocator<char> *__a;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaf8;
  region *in_stack_fffffffffffffb08;
  source_location in_stack_fffffffffffffb10;
  spec *in_stack_fffffffffffffb28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb58;
  location *in_stack_fffffffffffffba0;
  sequence *in_stack_fffffffffffffba8;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_390;
  char *local_330;
  char *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string *in_stack_fffffffffffffd00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd08;
  _Alloc_hider in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0 [5];
  undefined1 local_288 [32];
  uint local_268;
  allocator<char> local_261 [144];
  allocator<char> local_1d1 [361];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  last._M_current = &in_RDI->is_ok_;
  local_18 = in_RDX;
  location::location(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::basic_string(in_stack_fffffffffffffb28);
  sequence::scan(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  sequence::~sequence((sequence *)in_stack_fffffffffffffab0);
  bVar1 = region::is_ok((region *)0x734f96);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffffb08);
    __n = local_288;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8,
               (size_type)in_stack_fffffffffffffab0);
    std::__cxx11::string::string(in_stack_fffffffffffffac0);
    local_2b0[0]._M_current =
         (char *)CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffaa8);
    do {
      while( true ) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  (in_stack_fffffffffffffab8);
        bVar1 = __gnu_cxx::
                operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::make_pair<std::__cxx11::string&,toml::detail::region&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8,(region *)in_stack_fffffffffffffab0);
          ok<std::pair<std::__cxx11::string,toml::detail::region>>(in_stack_fffffffffffffb38);
          result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          ::result(in_stack_fffffffffffffab0,(success_type *)in_stack_fffffffffffffaa8);
          success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
          ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                      *)0x7355c4);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                   *)in_stack_fffffffffffffab0);
          local_268 = 1;
          goto LAB_0073561e;
        }
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_2b0);
        if (*pcVar2 == '\\') break;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_2b0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab0,(char)((ulong)in_stack_fffffffffffffaa8 >> 0x38));
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_2b0);
      }
      local_328 = local_2b0[0]._M_current;
      local_330 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffffab8);
      make_string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (in_stack_fffffffffffffaf8,last);
      in_stack_fffffffffffffab8 = &local_320;
      make_temporary_location(in_stack_fffffffffffffb58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      parse_escape_sequence<toml::type_config>(in_stack_00000a08,in_stack_00000a00);
      bVar1 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
              ::is_err(&local_390);
      if (bVar1) {
        in_stack_fffffffffffffab0 =
             (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
              *)result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::unwrap_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                              *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb10);
        err<toml::error_info&>((error_info *)in_stack_fffffffffffffb08);
        result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
        ::result(in_stack_fffffffffffffab0,(failure_type *)in_stack_fffffffffffffaa8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x7353dc);
      }
      else {
        in_stack_fffffffffffffaa8 =
             result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                       *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb10);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffab0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa8);
        location::get_location((location *)&stack0xfffffffffffffd00);
        std::advance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffad0,(unsigned_long)__n);
      }
      local_268 = (uint)bVar1;
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                 *)0x735503);
      location::~location((location *)in_stack_fffffffffffffab0);
    } while (local_268 == 0);
LAB_0073561e:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
  }
  else {
    __a = local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current,
               &in_RDI->is_ok_,__a);
    syntax::basic_string(in_stack_fffffffffffffb28);
    location::location(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current,
               &in_RDI->is_ok_,__a);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffd18,(sequence *)in_stack_fffffffffffffd10._M_p,
               (location *)in_stack_fffffffffffffd08._M_pi,in_stack_fffffffffffffd00);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffb08);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_fffffffffffffab0,(failure_type *)in_stack_fffffffffffffaa8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x73508d);
    error_info::~error_info((error_info *)in_stack_fffffffffffffab0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    std::allocator<char>::~allocator(local_261);
    location::~location((location *)in_stack_fffffffffffffab0);
    sequence::~sequence((sequence *)in_stack_fffffffffffffab0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    local_268 = 1;
  }
  region::~region((region *)in_stack_fffffffffffffab0);
  location::~location((location *)in_stack_fffffffffffffab0);
  return (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          *)last._M_current;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_basic_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_basic_string: "
            "invalid string format",
            syntax::basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\"');
    str.pop_back();
    assert(str.at(0) == '\"');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    using char_type   = typename string_type::value_type;
    string_type val;

    {
        auto iter = str.begin();
        while(iter != str.end())
        {
            if(*iter == '\\')
            {
                auto loc2 = make_temporary_location(make_string(iter, str.end()));

                auto esc = parse_escape_sequence(loc2, ctx);

                // syntax does not check its value. the unicode codepoint may be
                // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                if(esc.is_err())
                {
                    return err(esc.unwrap_err());
                }

                val += esc.unwrap();
                std::advance(iter, loc2.get_location());
            }
            else
            {
                val += char_type(*iter); // we already checked the syntax.
                ++iter;
            }
        }
    }
    return ok(std::make_pair(val, reg));
}